

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::MultiThreadedObjectTest::destroyObjects(MultiThreadedObjectTest *this,TestThread *thread)

{
  deUint32 dVar1;
  Library *pLVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  EndMessageToken *pEVar6;
  ThreadLog *pTVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  pLVar2 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  bVar12 = thread->m_id == 0;
  lVar11 = 0x1b8;
  if (bVar12) {
    lVar11 = 0x1a0;
  }
  lVar5 = 0x170;
  if (bVar12) {
    lVar5 = 0x158;
  }
  lVar3 = 0x128;
  if (bVar12) {
    lVar3 = 0x110;
  }
  lVar4 = 0x200;
  if (bVar12) {
    lVar4 = 0x1e8;
  }
  lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar11);
  lVar9 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx + lVar11);
  if (0 < (int)((ulong)(lVar9 - lVar10) >> 3)) {
    pTVar7 = &thread->m_log;
    lVar8 = 0;
    do {
      if (*(long *)(lVar10 + lVar8 * 8) != 0) {
        (*pLVar2->_vptr_Library[0x16])(pLVar2,(this->super_MultiThreadedTest).m_display);
        std::ostream::_M_insert<unsigned_long>((ulong)pTVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar7," = eglDestroySurface(",0x15);
        std::ostream::_M_insert<void_const*>(pTVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar7);
        pEVar6 = (EndMessageToken *)0x1adddc7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,")",1);
        ThreadLog::operator<<(pTVar7,pEVar6);
        dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
        eglu::checkError(dVar1,"eglDestroySurface()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5aa);
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar11) + lVar8 * 8) = 0;
        lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                  super_TestNode._vptr_TestNode + lVar11);
        lVar9 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx + lVar11);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)(lVar9 - lVar10) >> 3));
  }
  if (lVar9 != lVar10) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar11) = lVar10;
  }
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar5);
  lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar5);
  if (0 < (int)((ulong)(lVar10 - lVar11) >> 4)) {
    pTVar7 = &thread->m_log;
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (*(long *)(lVar11 + 8 + lVar8) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar7,"eglDestroySurface(",0x12);
        std::ostream::_M_insert<void_const*>(pTVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar7);
        pEVar6 = (EndMessageToken *)0x1adddc7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,")",1);
        ThreadLog::operator<<(pTVar7,pEVar6);
        (*pLVar2->_vptr_Library[0x16])
                  (pLVar2,(this->super_MultiThreadedTest).m_display,
                   *(undefined8 *)
                    (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                      super_TestNode._vptr_TestNode + lVar5) + 8 + lVar8));
        dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
        eglu::checkError(dVar1,"destroySurface(m_display, windows[windowNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5b5);
        lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                  super_TestNode._vptr_TestNode + lVar5);
        *(undefined8 *)(lVar11 + 8 + lVar8) = 0;
      }
      if (*(long **)(lVar11 + lVar8) != (long *)0x0) {
        (**(code **)(**(long **)(lVar11 + lVar8) + 8))();
        lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                  super_TestNode._vptr_TestNode + lVar5);
        *(undefined8 *)(lVar11 + lVar8) = 0;
      }
      lVar9 = lVar9 + 1;
      lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar5);
      lVar8 = lVar8 + 0x10;
    } while (lVar9 < (int)((ulong)(lVar10 - lVar11) >> 4));
  }
  if (lVar10 != lVar11) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar5) = lVar11;
  }
  lVar5 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar3);
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar3);
  if (0 < (int)((ulong)(lVar11 - lVar5) >> 4)) {
    pTVar7 = &thread->m_log;
    lVar9 = 0;
    lVar10 = 0;
    do {
      if (*(long *)(lVar5 + lVar9) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar7,"eglDestroySurface(",0x12);
        std::ostream::_M_insert<void_const*>(pTVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar7);
        pEVar6 = (EndMessageToken *)0x1adddc7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,")",1);
        ThreadLog::operator<<(pTVar7,pEVar6);
        (*pLVar2->_vptr_Library[0x16])
                  (pLVar2,(this->super_MultiThreadedTest).m_display,
                   *(undefined8 *)
                    (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                      super_TestNode._vptr_TestNode + lVar3) + 8 + lVar9));
        dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
        eglu::checkError(dVar1,"destroySurface(m_display, pixmaps[pixmapNdx].second)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5c6);
        lVar5 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                 super_TestNode._vptr_TestNode + lVar3);
        *(undefined8 *)(lVar5 + 8 + lVar9) = 0;
        if (*(long **)(lVar5 + lVar9) != (long *)0x0) {
          (**(code **)(**(long **)(lVar5 + lVar9) + 8))();
          lVar5 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                   super_TestNode._vptr_TestNode + lVar3);
          *(undefined8 *)(lVar5 + lVar9) = 0;
        }
      }
      lVar10 = lVar10 + 1;
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar3);
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < (int)((ulong)(lVar11 - lVar5) >> 4));
  }
  if (lVar11 != lVar5) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar3) = lVar5;
  }
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar4);
  lVar5 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx + lVar4);
  if (0 < (int)((ulong)(lVar5 - lVar11) >> 3)) {
    pTVar7 = &thread->m_log;
    lVar3 = 0;
    do {
      if (*(long *)(lVar11 + lVar3 * 8) != 0) {
        (*pLVar2->_vptr_Library[0x13])(pLVar2,(this->super_MultiThreadedTest).m_display);
        dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
        eglu::checkError(dVar1,"destroyContext(m_display, contexts[contextNdx])",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                         ,0x5d6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pTVar7,"eglDestroyContext(",0x12);
        std::ostream::_M_insert<void_const*>(pTVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,", ",2);
        std::ostream::_M_insert<void_const*>(pTVar7);
        pEVar6 = (EndMessageToken *)0x1adddc7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar7,")",1);
        ThreadLog::operator<<(pTVar7,pEVar6);
        *(undefined8 *)
         (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar4) + lVar3 * 8) = 0;
        lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                  super_TestNode._vptr_TestNode + lVar4);
        lVar5 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                 super_TestNode.m_testCtx + lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)(lVar5 - lVar11) >> 3));
  }
  if (lVar5 != lVar11) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar4) = lVar11;
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::destroyObjects (TestThread& thread)
{
	const Library&										egl			= getLibrary();
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
	{
		if (pbuffers[pbufferNdx] != EGL_NO_SURFACE)
		{
			// Destroy EGLSurface
			EGLBoolean result;

			result = egl.destroySurface(m_display, pbuffers[pbufferNdx]);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglDestroySurface(" << m_display << ", " << pbuffers[pbufferNdx] << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			pbuffers[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
	{
		if (windows[windowNdx].second != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << windows[windowNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, windows[windowNdx].second));
			windows[windowNdx].second = EGL_NO_SURFACE;
		}

		if (windows[windowNdx].first)
		{
			delete windows[windowNdx].first;
			windows[windowNdx].first = NULL;
		}
	}
	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
	{
		if (pixmaps[pixmapNdx].first != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << pixmaps[pixmapNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, pixmaps[pixmapNdx].second));
			pixmaps[pixmapNdx].second = EGL_NO_SURFACE;
		}

		if (pixmaps[pixmapNdx].first)
		{
			delete pixmaps[pixmapNdx].first;
			pixmaps[pixmapNdx].first = NULL;
		}
	}
	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
	{
		if (contexts[contextNdx] != EGL_NO_CONTEXT)
		{
			EGLU_CHECK_CALL(egl, destroyContext(m_display, contexts[contextNdx]));
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroyContext(" << m_display << ", " << contexts[contextNdx]  << ")" << ThreadLog::EndMessage;
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}
	}
	contexts.clear();
}